

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapl-configure.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  uint32_t uVar2;
  bool bVar3;
  int is_read_only;
  uint32_t count;
  int c;
  int ret;
  rapl_configure_ctx ctx;
  char **argv_local;
  int argc_local;
  
  ctx.limit_constraint.watts = (double)argv;
  memset(&c,0,0x68);
  prog = *(char **)ctx.limit_constraint.watts;
  do {
    iVar1 = getopt_long(argc,ctx.limit_constraint.watts,"nNc:d:z:l:t:p:e:s:w:S:W:C:Lh",long_options,
                        0);
    if (iVar1 == -1) {
      if (c == 0) {
        if (ret == 0) {
          bVar3 = false;
          if (((ctx.die == 0) && (bVar3 = false, ctx.enabled == 0)) &&
             (bVar3 = false, ctx.limit_long.watts._0_4_ == 0)) {
            bVar3 = ctx.limit_short.watts._0_4_ == 0;
          }
          if (bVar3) {
            setenv("RAPLCAP_READ_ONLY","1",0);
          }
          iVar1 = raplcap_init((raplcap *)0x0);
          if (iVar1 == 0) {
            count = check_zone_supported((rapl_configure_ctx *)&c);
            if (count == 0) {
              if (bVar3) {
                count = get_limits(ctx.zone,ctx.constraint,ctx.get_packages);
              }
              else {
                count = check_constraint_supported((rapl_configure_ctx *)&c);
                if (count == 0) {
                  count = configure_limits((rapl_configure_ctx *)&c);
                }
              }
            }
            iVar1 = raplcap_destroy((raplcap *)0x0);
            if (iVar1 != 0) {
              perror("Failed to clean up");
            }
            argv_local._4_4_ = count;
          }
          else {
            perror("Failed to initialize");
            argv_local._4_4_ = 1;
          }
        }
        else {
          uVar2 = raplcap_get_num_die((raplcap *)0x0,ctx.zone);
          if (uVar2 == 0) {
            perror("Failed to get number of die");
            argv_local._4_4_ = 1;
          }
          else {
            printf("%u\n",(ulong)uVar2);
            argv_local._4_4_ = 0;
          }
        }
      }
      else {
        uVar2 = raplcap_get_num_packages((raplcap *)0x0);
        if (uVar2 == 0) {
          perror("Failed to get number of packages");
          argv_local._4_4_ = 1;
        }
        else {
          printf("%u\n",(ulong)uVar2);
          argv_local._4_4_ = 0;
        }
      }
      return argv_local._4_4_;
    }
    switch(iVar1) {
    case 0x3f:
    default:
      print_usage(1);
    case 0x4e:
      ret = 1;
      break;
    case 0x53:
      ctx._56_8_ = atof(_optarg);
      if ((double)ctx._56_8_ <= 0.0) {
        fprintf(_stderr,"Time window and power limit values must be > 0\n");
        print_usage(1);
      }
      ctx.limit_long.watts._0_4_ = 1;
      break;
    case 0x57:
      ctx.limit_short.seconds = atof(_optarg);
      if (ctx.limit_short.seconds <= 0.0) {
        fprintf(_stderr,"Time window and power limit values must be > 0\n");
        print_usage(1);
      }
      ctx.limit_long.watts._0_4_ = 1;
      break;
    case 99:
      ctx.zone = atoi(_optarg);
      break;
    case 100:
      ctx.constraint = atoi(_optarg);
      break;
    case 0x65:
      ctx.pkg = atoi(_optarg);
      ctx.die = 1;
      break;
    case 0x68:
      print_usage(0);
    case 0x6c:
      iVar1 = strcmp(_optarg,"LONG");
      if (iVar1 == 0) {
        ctx.get_die = 0;
      }
      else {
        iVar1 = strcmp(_optarg,"SHORT");
        if (iVar1 == 0) {
          ctx.get_die = 1;
        }
        else {
          iVar1 = strcmp(_optarg,"PEAK");
          if (iVar1 != 0) {
            print_usage(1);
          }
          ctx.get_die = 2;
        }
      }
      break;
    case 0x6e:
      c = 1;
      break;
    case 0x70:
      ctx.limit_constraint.seconds = atof(_optarg);
      if (ctx.limit_constraint.seconds <= 0.0) {
        fprintf(_stderr,"Time window and power limit values must be > 0\n");
        print_usage(1);
      }
      ctx.limit_short.watts._0_4_ = 1;
      break;
    case 0x73:
      ctx._32_8_ = atof(_optarg);
      if ((double)ctx._32_8_ <= 0.0) {
        fprintf(_stderr,"Time window and power limit values must be > 0\n");
        print_usage(1);
      }
      ctx.enabled = 1;
      break;
    case 0x74:
      ctx._80_8_ = atof(_optarg);
      if ((double)ctx._80_8_ <= 0.0) {
        fprintf(_stderr,"Time window and power limit values must be > 0\n");
        print_usage(1);
      }
      ctx.limit_short.watts._0_4_ = 1;
      break;
    case 0x77:
      ctx.limit_long.seconds = atof(_optarg);
      if (ctx.limit_long.seconds <= 0.0) {
        fprintf(_stderr,"Time window and power limit values must be > 0\n");
        print_usage(1);
      }
      ctx.enabled = 1;
      break;
    case 0x7a:
      iVar1 = strcmp(_optarg,"PACKAGE");
      if (iVar1 == 0) {
        ctx.get_packages = 0;
      }
      else {
        iVar1 = strcmp(_optarg,"CORE");
        if (iVar1 == 0) {
          ctx.get_packages = 1;
        }
        else {
          iVar1 = strcmp(_optarg,"UNCORE");
          if (iVar1 == 0) {
            ctx.get_packages = 2;
          }
          else {
            iVar1 = strcmp(_optarg,"DRAM");
            if (iVar1 == 0) {
              ctx.get_packages = 3;
            }
            else {
              iVar1 = strcmp(_optarg,"PSYS");
              if (iVar1 != 0) {
                print_usage(1);
              }
              ctx.get_packages = 4;
            }
          }
        }
      }
    }
  } while( true );
}

Assistant:

int main(int argc, char** argv) {
  rapl_configure_ctx ctx = { 0 };
  int ret = 0;
  int c;
  uint32_t count;
  prog = argv[0];
  int is_read_only;

  // parse parameters
  while ((c = getopt_long(argc, argv, short_options, long_options, NULL)) != -1) {
    switch (c) {
      case 'h':
        print_usage(0);
        break;
      case 'c':
        ctx.pkg = (unsigned int) atoi(optarg);
        break;
      case 'd':
        ctx.die = (unsigned int) atoi(optarg);
        break;
      case 'n':
        ctx.get_packages = 1;
        break;
      case 'N':
        ctx.get_die = 1;
        break;
      case 'z':
        if (!strcmp(optarg, "PACKAGE")) {
          ctx.zone = RAPLCAP_ZONE_PACKAGE;
        } else if (!strcmp(optarg, "CORE")) {
          ctx.zone = RAPLCAP_ZONE_CORE;
        } else if (!strcmp(optarg, "UNCORE")) {
          ctx.zone = RAPLCAP_ZONE_UNCORE;
        } else if (!strcmp(optarg, "DRAM")) {
          ctx.zone = RAPLCAP_ZONE_DRAM;
        } else if (!strcmp(optarg, "PSYS")) {
          ctx.zone = RAPLCAP_ZONE_PSYS;
        } else {
          print_usage(1);
        }
        break;
      case 'l':
        if (!strcmp(optarg, "LONG")) {
          ctx.constraint = RAPLCAP_CONSTRAINT_LONG_TERM;
        } else if (!strcmp(optarg, "SHORT")) {
          ctx.constraint = RAPLCAP_CONSTRAINT_SHORT_TERM;
        } else if (!strcmp(optarg, "PEAK")) {
          ctx.constraint = RAPLCAP_CONSTRAINT_PEAK_POWER;
        } else {
          print_usage(1);
        }
        break;
      case 't':
        SET_VAL(optarg, ctx.limit_constraint.seconds, ctx.set_constraint);
        break;
      case 'p':
        SET_VAL(optarg, ctx.limit_constraint.watts, ctx.set_constraint);
        break;
      case 'e':
        ctx.enabled = atoi(optarg);
        ctx.set_enabled = 1;
        break;
      case 's':
        SET_VAL(optarg, ctx.limit_long.seconds, ctx.set_long);
        break;
      case 'w':
        SET_VAL(optarg, ctx.limit_long.watts, ctx.set_long);
        break;
      case 'S':
        SET_VAL(optarg, ctx.limit_short.seconds, ctx.set_short);
        break;
      case 'W':
        SET_VAL(optarg, ctx.limit_short.watts, ctx.set_short);
        break;
#ifdef RAPLCAP_msr
      case 'C':
        ctx.clamped = atoi(optarg);
        ctx.set_clamped = 1;
        break;
      case 'L':
        ctx.set_locked = 1;
        break;
#endif // RAPLCAP_msr
      case '?':
      default:
        print_usage(1);
        break;
    }
  }

  // just print the number of packages or die and exit
  // these are often unprivileged operations since we don't need to initialize a raplcap instance
  if (ctx.get_packages) {
    count = raplcap_get_num_packages(NULL);
    if (count == 0) {
      perror("Failed to get number of packages");
      return 1;
    }
    printf("%"PRIu32"\n", count);
    return 0;
  }
  if (ctx.get_die) {
    count = raplcap_get_num_die(NULL, ctx.pkg);
    if (count == 0) {
      perror("Failed to get number of die");
      return 1;
    }
    printf("%"PRIu32"\n", count);
    return 0;
  }

  // initialize
  is_read_only = !ctx.set_enabled && !ctx.set_long && !ctx.set_short && !ctx.set_constraint;
#ifdef RAPLCAP_msr
  is_read_only &= !ctx.set_clamped && !ctx.set_locked;
#endif // RAPLCAP_msr
#ifndef _WIN32
  if (is_read_only) {
    // request read-only access (not supported by all implementations, therefore not guaranteed)
    setenv(ENV_RAPLCAP_READ_ONLY, "1", 0);
  }
#endif
  if (raplcap_init(NULL)) {
    perror("Failed to initialize");
    return 1;
  }

  if (!(ret = check_zone_supported(&ctx))) {
    // perform requested action
    if (is_read_only) {
      // TODO: Should we limit output by constraint, too?
      ret = get_limits(ctx.pkg, ctx.die, ctx.zone);
    } else if (!(ret = check_constraint_supported(&ctx))) {
      ret = configure_limits(&ctx);
    }
  }

  // cleanup
  if (raplcap_destroy(NULL)) {
    perror("Failed to clean up");
  }

  return ret;
}